

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void libtorrent::dht::anon_unknown_0::put_data_cb
               (item *i,bool auth,shared_ptr<libtorrent::dht::put_data> *ta,
               function<void_(libtorrent::dht::item_&)> *f)

{
  undefined7 in_register_00000031;
  item copy;
  item local_d0;
  
  if ((int)CONCAT71(in_register_00000031,auth) != 0) {
    item::item(&local_d0,i);
    ::std::function<void_(libtorrent::dht::item_&)>::operator()(f,&local_d0);
    item::operator=(&((ta->super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->m_data,&local_d0);
    item::~item(&local_d0);
  }
  return;
}

Assistant:

void put_data_cb(item const& i, bool auth
	, std::shared_ptr<put_data> const& ta
	, std::function<void(item&)> const& f)
{
	// call data_callback only when we got authoritative data.
	if (auth)
	{
		item copy(i);
		f(copy);
		ta->set_data(std::move(copy));
	}
}